

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

void * rw::ps2::destroyNativeRaster(void *object,int32 offset,int32 param_3)

{
  Ps2Raster *raster;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  freealign(*(void **)((long)object + (long)nativeRasterOffset + 0x30));
  return object;
}

Assistant:

static void*
destroyNativeRaster(void *object, int32 offset, int32)
{
	Ps2Raster *raster = GETPS2RASTEREXT(object);
	freealign(raster->data);
	return object;
}